

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O2

result<toml::basic_value<toml::type_config>,_toml::error_info> *
toml::detail::parse_dec_integer<toml::type_config>
          (result<toml::basic_value<toml::type_config>,_toml::error_info> *__return_storage_ptr__,
          location *loc,context<toml::type_config> *ctx)

{
  long lVar1;
  size_type sVar2;
  char_type_conflict cVar3;
  difference_type dVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  error_info *v;
  basic_value<toml::type_config> *v_00;
  basic_value<toml::type_config> *__str;
  string *psVar5;
  allocator<char> local_7f2;
  allocator<char> local_7f1;
  string str;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  first_underscore;
  integer_format_info fmt;
  string sfx;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_728;
  undefined8 local_718;
  string local_708;
  string local_6e8;
  pointer local_6c8;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_6c0;
  string local_6b8;
  string local_698;
  region sfx_reg;
  result<long,_toml::error_info> val;
  location first;
  source_location src;
  region reg;
  location local_428;
  undefined1 local_3e0 [56];
  source_location local_3a8;
  source_location local_330;
  region local_2b8;
  error_info local_250;
  error_info local_1f8;
  basic_value<toml::type_config> local_1a0;
  error_info local_d8;
  error_info local_80;
  
  location::location(&first,loc);
  syntax::dec_int((sequence *)&sfx_reg,&ctx->toml_spec_);
  sequence::scan(&reg,(sequence *)&sfx_reg,loc);
  std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
  ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *)
          &sfx_reg.source_.
           super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
           ._M_refcount);
  if (reg.source_.
      super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr == (element_type *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_698,
               "toml::parse_dec_integer: invalid integer: dec_int must be like: 42, 123_456_789",
               (allocator<char> *)&sfx);
    syntax::dec_int((sequence *)&src,&ctx->toml_spec_);
    location::location(&local_428,loc);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_6b8,"",(allocator<char> *)&val);
    make_syntax_error<toml::detail::sequence>
              ((error_info *)&sfx_reg,&local_698,(sequence *)&src,&local_428,&local_6b8);
    err<toml::error_info>((failure<toml::error_info> *)&local_80,(error_info *)&sfx_reg);
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_80);
    error_info::~error_info(&local_80);
    error_info::~error_info((error_info *)&sfx_reg);
    std::__cxx11::string::~string((string *)&local_6b8);
    location::~location(&local_428);
    std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
    ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_> *
            )&src.first_line_);
    psVar5 = &local_698;
    goto LAB_0033d7b0;
  }
  region::as_string_abi_cxx11_(&str,&reg);
  integer_format_info::integer_format_info(&fmt);
  sVar2 = str._M_string_length;
  fmt.fmt = dec;
  sfx_reg.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0x5f;
  dVar4 = std::
          __count_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                    ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )str._M_dataplus._M_p,
                     (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      )(str._M_dataplus._M_p + str._M_string_length),
                     (_Iter_equals_val<const_char>)&sfx_reg);
  fmt.width = sVar2 - dVar4;
  local_6c0.current._M_current =
       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        )(str._M_dataplus._M_p + str._M_string_length);
  local_6c8 = str._M_dataplus._M_p;
  sfx_reg.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0x5f;
  std::find<std::reverse_iterator<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>>,char>
            (&first_underscore,&local_6c0,(char *)&local_6c8);
  if (first_underscore.current._M_current !=
      (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       )str._M_dataplus._M_p) {
    fmt.spacer = (size_t)(str._M_dataplus._M_p +
                         (str._M_string_length - (long)first_underscore.current._M_current));
  }
  sfx_reg.source_.
  super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr._0_1_ = 0x5f;
  __first = std::
            __remove_if<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__ops::_Iter_equals_val<char_const>>
                      ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )str._M_dataplus._M_p,
                       (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(str._M_dataplus._M_p + str._M_string_length),
                       (_Iter_equals_val<const_char>)&sfx_reg);
  CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&str,
             (__const_iterator)__first._M_current,
             (__const_iterator)(str._M_dataplus._M_p + str._M_string_length));
  region::region(&sfx_reg,loc);
  source_location::source_location(&src,&sfx_reg);
  region::~region(&sfx_reg);
  source_location::source_location(&local_330,&src);
  type_config::parse_int(&val,&str,&local_330,'\n');
  source_location::~source_location(&local_330);
  if (val.is_ok_ == false) {
    location::operator=(loc,&first);
    err<toml::error_info_const&>
              ((failure<toml::error_info> *)&local_1f8,(toml *)&val.field_1.succ_,v);
    __str = (basic_value<toml::type_config> *)&local_1f8;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(failure_type *)&local_1f8);
    error_info::~error_info(&local_1f8);
  }
  else {
    if ((ctx->toml_spec_).ext_num_suffix == true) {
      cVar3 = location::current(loc);
      if (cVar3 == '_') {
        syntax::num_suffix((sequence *)&sfx,&ctx->toml_spec_);
        sequence::scan(&sfx_reg,(sequence *)&sfx,loc);
        std::vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>::
        ~vector((vector<toml::detail::scanner_storage,_std::allocator<toml::detail::scanner_storage>_>
                 *)&sfx._M_string_length);
        lVar1 = CONCAT71(sfx_reg.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._1_7_,
                         sfx_reg.source_.
                         super___shared_ptr<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr._0_1_);
        if (lVar1 == 0) {
          location::operator=(loc,&first);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_6e8,
                     "toml::parse_dec_integer: invalid suffix: should be `_ non-digit-graph (graph | _graph)`"
                     ,&local_7f1);
          region::region((region *)&sfx,loc);
          source_location::source_location(&local_3a8,(region *)&sfx);
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_708,"here",&local_7f2)
          ;
          make_error_info<>(&local_250,&local_6e8,&local_3a8,&local_708);
          err<toml::error_info>((failure<toml::error_info> *)&local_d8,&local_250);
          __str = (basic_value<toml::type_config> *)&local_d8;
          result<toml::basic_value<toml::type_config>,_toml::error_info>::result
                    (__return_storage_ptr__,(failure_type *)&local_d8);
          error_info::~error_info(&local_d8);
          error_info::~error_info(&local_250);
          std::__cxx11::string::~string((string *)&local_708);
          source_location::~source_location(&local_3a8);
          region::~region((region *)&sfx);
          psVar5 = &local_6e8;
        }
        else {
          region::as_string_abi_cxx11_(&sfx,&sfx_reg);
          std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::erase
                    (&sfx,(__const_iterator)sfx._M_dataplus._M_p);
          __str = (basic_value<toml::type_config> *)&sfx;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_assign((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&fmt.suffix
                    ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__str);
          psVar5 = &sfx;
        }
        std::__cxx11::string::~string((string *)psVar5);
        region::~region(&sfx_reg);
        if (lVar1 == 0) goto LAB_0033d787;
      }
    }
    integer_format_info::integer_format_info((integer_format_info *)local_3e0,&fmt);
    local_728._M_allocated_capacity = 0;
    local_728._8_8_ = 0;
    local_718 = 0;
    region::region(&local_2b8,&reg);
    basic_value<toml::type_config>::basic_value
              ((basic_value<toml::type_config> *)&sfx_reg,(integer_type)val.field_1.succ_.value,
               (integer_format_info *)local_3e0,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&local_728,&local_2b8);
    ok<toml::basic_value<toml::type_config>>
              ((success<toml::basic_value<toml::type_config>_> *)&local_1a0,(toml *)&sfx_reg,v_00);
    __str = &local_1a0;
    result<toml::basic_value<toml::type_config>,_toml::error_info>::result
              (__return_storage_ptr__,(success_type *)__str);
    basic_value<toml::type_config>::~basic_value(&local_1a0);
    basic_value<toml::type_config>::~basic_value((basic_value<toml::type_config> *)&sfx_reg);
    region::~region(&local_2b8);
    CLI::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_728);
    std::__cxx11::string::~string((string *)(local_3e0 + 0x18));
  }
LAB_0033d787:
  result<long,_toml::error_info>::cleanup(&val,(EVP_PKEY_CTX *)__str);
  source_location::~source_location(&src);
  std::__cxx11::string::~string((string *)&fmt.suffix);
  psVar5 = &str;
LAB_0033d7b0:
  std::__cxx11::string::~string((string *)psVar5);
  region::~region(&reg);
  location::~location(&first);
  return __return_storage_ptr__;
}

Assistant:

result<basic_value<TC>, error_info>
parse_dec_integer(location& loc, const context<TC>& ctx)
{
    const auto first = loc;
    const auto& spec = ctx.toml_spec();

    // ----------------------------------------------------------------------
    // check syntax
    auto reg = syntax::dec_int(spec).scan(loc);
    if( ! reg.is_ok())
    {
        return err(make_syntax_error("toml::parse_dec_integer: "
            "invalid integer: dec_int must be like: 42, 123_456_789",
            syntax::dec_int(spec), loc));
    }

    // ----------------------------------------------------------------------
    // it matches. gen value
    auto str = reg.as_string();

    integer_format_info fmt;
    fmt.fmt = integer_format::dec;
    fmt.width = str.size() - static_cast<std::size_t>(std::count(str.begin(), str.end(), '_'));

    const auto first_underscore = std::find(str.rbegin(), str.rend(), '_');
    if(first_underscore != str.rend())
    {
        fmt.spacer = static_cast<std::size_t>(std::distance(str.rbegin(), first_underscore));
    }

    // remove all `_` before calling TC::parse_int
    str.erase(std::remove(str.begin(), str.end(), '_'), str.end());

    auto src = source_location(region(loc));
    const auto val = TC::parse_int(str, src, 10);
    if(val.is_err())
    {
        loc = first;
        return err(val.as_err());
    }

    // ----------------------------------------------------------------------
    // parse suffix (extension)

    if(spec.ext_num_suffix && loc.current() == '_')
    {
        const auto sfx_reg = syntax::num_suffix(spec).scan(loc);
        if( ! sfx_reg.is_ok())
        {
            loc = first;
            return err(make_error_info("toml::parse_dec_integer: "
                "invalid suffix: should be `_ non-digit-graph (graph | _graph)`",
                source_location(region(loc)), "here"));
        }
        auto sfx = sfx_reg.as_string();
        assert( ! sfx.empty() && sfx.front() == '_');
        sfx.erase(sfx.begin()); // remove the first `_`

        fmt.suffix = sfx;
    }

    return ok(basic_value<TC>(val.as_ok(), std::move(fmt), {}, std::move(reg)));
}